

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

arena_t * duckdb_je_arena_choose_huge(tsd_t *tsd)

{
  arena_t *paVar1;
  
  paVar1 = (arena_t *)duckdb_je_arenas[huge_arena_ind].repr;
  if (paVar1 == (arena_t *)0x0) {
    paVar1 = (arena_t *)duckdb_je_arenas[huge_arena_ind].repr;
    if (paVar1 == (arena_t *)0x0) {
      paVar1 = duckdb_je_arena_init((tsdn_t *)tsd,huge_arena_ind,&duckdb_je_arena_config_default);
    }
    if (paVar1 == (arena_t *)0x0) {
      paVar1 = (arena_t *)0x0;
    }
    else {
      paVar1->name[0xf] = '\0';
      paVar1->name[0x10] = '\0';
      paVar1->name[0x11] = '\0';
      paVar1->name[0x12] = '\0';
      paVar1->name[0x13] = '\0';
      paVar1->name[0x14] = '\0';
      paVar1->name[0x15] = '\0';
      paVar1->name[0x16] = '\0';
      paVar1->name[0x17] = '\0';
      paVar1->name[0x18] = '\0';
      paVar1->name[0x19] = '\0';
      paVar1->name[0x1a] = '\0';
      paVar1->name[0x1b] = '\0';
      paVar1->name[0x1c] = '\0';
      paVar1->name[0x1d] = '\0';
      paVar1->name[0x1e] = '\0';
      builtin_strncpy(paVar1->name,"auto_oversize",0xe);
      paVar1->name[0xe] = '\0';
      paVar1->name[0xf] = '\0';
      paVar1->name[0x1f] = '\0';
      if (((duckdb_je_background_thread_enabled_state.repr & 1U) == 0) &&
         (0 < dirty_decay_ms_default.repr)) {
        duckdb_je_pa_decay_ms_set
                  ((tsdn_t *)tsd,&paVar1->pa_shard,extent_state_dirty,0,
                   PAC_PURGE_ON_EPOCH_ADVANCE - (duckdb_je_background_thread_enabled_state.repr & 1)
                  );
      }
      if (((duckdb_je_background_thread_enabled_state.repr & 1U) == 0) &&
         (0 < muzzy_decay_ms_default.repr)) {
        duckdb_je_pa_decay_ms_set
                  ((tsdn_t *)tsd,&paVar1->pa_shard,extent_state_muzzy,0,
                   PAC_PURGE_ON_EPOCH_ADVANCE - (duckdb_je_background_thread_enabled_state.repr & 1)
                  );
      }
    }
  }
  return paVar1;
}

Assistant:

arena_t *
arena_choose_huge(tsd_t *tsd) {
	/* huge_arena_ind can be 0 during init (will use a0). */
	if (huge_arena_ind == 0) {
		assert(!malloc_initialized());
	}

	arena_t *huge_arena = arena_get(tsd_tsdn(tsd), huge_arena_ind, false);
	if (huge_arena == NULL) {
		/* Create the huge arena on demand. */
		huge_arena = arena_create_huge_arena(tsd, huge_arena_ind);
	}

	return huge_arena;
}